

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateGetEnumDescriptorSpecializations
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  Descriptor *pDVar1;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  int i;
  long lVar2;
  
  for (lVar2 = 0; pDVar1 = this->descriptor_, lVar2 < *(int *)(pDVar1 + 0x38); lVar2 = lVar2 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar2);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateGetEnumDescriptorSpecializations(this_01,printer);
  }
  for (lVar2 = 0; lVar2 < *(int *)(pDVar1 + 0x48); lVar2 = lVar2 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,lVar2);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_02);
    EnumGenerator::GenerateGetEnumDescriptorSpecializations(this_03,printer);
    pDVar1 = this->descriptor_;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateGetEnumDescriptorSpecializations(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
  }
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
  }
}